

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.c
# Opt level: O2

StringView CpuFeatures_StringView_TrimWhitespace(StringView view)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  StringView SVar7;
  
  pcVar6 = view.ptr;
  pcVar1 = pcVar6 + view.size;
  sVar4 = view.size;
  while ((pcVar3 = pcVar1, sVar4 != 0 &&
         (ppuVar2 = __ctype_b_loc(), pcVar3 = pcVar6,
         (*(byte *)((long)*ppuVar2 + (long)*pcVar6 * 2 + 1) & 0x20) != 0))) {
    pcVar6 = pcVar6 + 1;
    sVar4 = sVar4 - 1;
  }
  do {
    sVar5 = sVar4;
    if (sVar5 == 0) break;
    ppuVar2 = __ctype_b_loc();
    sVar4 = sVar5 - 1;
  } while ((*(byte *)((long)*ppuVar2 + (long)pcVar3[sVar5 - 1] * 2 + 1) & 0x20) != 0);
  SVar7.size = sVar5;
  SVar7.ptr = pcVar3;
  return SVar7;
}

Assistant:

StringView CpuFeatures_StringView_TrimWhitespace(StringView view) {
  while (view.size && isspace(CpuFeatures_StringView_Front(view)))
    view = CpuFeatures_StringView_PopFront(view, 1);
  while (view.size && isspace(CpuFeatures_StringView_Back(view)))
    view = CpuFeatures_StringView_PopBack(view, 1);
  return view;
}